

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O0

void __thiscall
cpp_db::sqlite_result::sqlite_result(sqlite_result *this,shared_statement_ptr *stmt_in)

{
  int iVar1;
  int iVar2;
  sqlite3_stmt *psVar3;
  char *local_30;
  int local_28 [2];
  int column;
  shared_ptr<cpp_db::statement_interface> *local_18;
  shared_statement_ptr *stmt_in_local;
  sqlite_result *this_local;
  
  local_18 = stmt_in;
  stmt_in_local = (shared_statement_ptr *)this;
  result_interface::result_interface(&this->super_result_interface);
  (this->super_result_interface)._vptr_result_interface = (_func_int **)&PTR__sqlite_result_001356e0
  ;
  std::shared_ptr<cpp_db::statement_interface>::shared_ptr(&this->stmt,local_18);
  this->row_status = 0x65;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->column_names);
  (*(this->super_result_interface)._vptr_result_interface[4])();
  local_28[0] = 0;
  while( true ) {
    iVar1 = local_28[0];
    iVar2 = (*(this->super_result_interface)._vptr_result_interface[2])();
    if (iVar2 <= iVar1) break;
    psVar3 = get_stmt_handle(this);
    local_30 = (char *)sqlite3_column_name(psVar3,local_28[0]);
    std::
    unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::emplace<char_const*,int&>
              ((unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->column_names,&local_30,local_28);
    local_28[0] = local_28[0] + 1;
  }
  return;
}

Assistant:

sqlite_result::sqlite_result(const shared_statement_ptr &stmt_in)
	: stmt(stmt_in)
    , row_status(SQLITE_DONE)
{
    move_next();
    for (int column = 0; column < get_column_count(); ++column)
		column_names.emplace(sqlite3_column_name(get_stmt_handle(), column), column);
}